

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

void monster_remove_from_targets(chunk *c,monster *mon)

{
  wchar_t wVar1;
  monster_conflict *pmVar2;
  monster *mon1;
  wchar_t i;
  monster *mon_local;
  chunk *c_local;
  
  for (mon1._4_4_ = L'\x01'; wVar1 = cave_monster_max((chunk_conflict *)c), mon1._4_4_ < wVar1;
      mon1._4_4_ = mon1._4_4_ + L'\x01') {
    pmVar2 = cave_monster((chunk_conflict *)c,mon1._4_4_);
    if ((pmVar2->race != (monster_race *)0x0) && ((pmVar2->target).midx == mon->midx)) {
      (pmVar2->target).midx = L'\0';
    }
  }
  return;
}

Assistant:

void monster_remove_from_targets(struct chunk *c, struct monster *mon)
{
	int i;
	for (i = 1; i < cave_monster_max(c); i++) {
		struct monster *mon1 = cave_monster(c, i);
		if (!mon1->race) continue;
		if (mon1->target.midx == mon->midx) {
			mon1->target.midx = 0;
		}
	}
}